

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O2

uint8_t * icu_63::BytesTrie::findUniqueValueFromBranch
                    (uint8_t *pos,int32_t length,UBool haveUniqueValue,int32_t *uniqueValue)

{
  byte bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint8_t *puVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)length;
  while (iVar5 = (int)uVar6, 5 < iVar5) {
    puVar4 = jumpByDelta(pos + 1);
    iVar3 = (int32_t)(uVar6 >> 1);
    puVar4 = findUniqueValueFromBranch(puVar4,iVar3,haveUniqueValue,uniqueValue);
    if (puVar4 == (uint8_t *)0x0) {
      return (uint8_t *)0x0;
    }
    pos = skipDelta(pos + 1);
    uVar6 = (ulong)(uint)(iVar5 - iVar3);
  }
  iVar5 = iVar5 + 1;
  do {
    puVar4 = pos + 2;
    bVar1 = pos[1];
    iVar3 = readValue(puVar4,(uint)(bVar1 >> 1));
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        puVar4 = pos + 3;
      }
      else if (bVar1 < 0xfc) {
        puVar4 = pos + 4;
      }
      else {
        puVar4 = puVar4 + (ulong)(bVar1 >> 1 & 1) + 3;
      }
    }
    if ((bVar1 & 1) == 0) {
      UVar2 = findUniqueValue(puVar4 + iVar3,haveUniqueValue,uniqueValue);
      haveUniqueValue = '\x01';
      if (UVar2 == '\0') {
        return (uint8_t *)0x0;
      }
    }
    else if (haveUniqueValue == '\0') {
      *uniqueValue = iVar3;
      haveUniqueValue = '\x01';
    }
    else if (iVar3 != *uniqueValue) {
      return (uint8_t *)0x0;
    }
    iVar5 = iVar5 + -1;
    pos = puVar4;
  } while (2 < iVar5);
  return puVar4 + 1;
}

Assistant:

const uint8_t *
BytesTrie::findUniqueValueFromBranch(const uint8_t *pos, int32_t length,
                                     UBool haveUniqueValue, int32_t &uniqueValue) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison byte
        if(NULL==findUniqueValueFromBranch(jumpByDelta(pos), length>>1, haveUniqueValue, uniqueValue)) {
            return NULL;
        }
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        ++pos;  // ignore a comparison byte
        // handle its value
        int32_t node=*pos++;
        UBool isFinal=(UBool)(node&kValueIsFinal);
        int32_t value=readValue(pos, node>>1);
        pos=skipValue(pos, node);
        if(isFinal) {
            if(haveUniqueValue) {
                if(value!=uniqueValue) {
                    return NULL;
                }
            } else {
                uniqueValue=value;
                haveUniqueValue=TRUE;
            }
        } else {
            if(!findUniqueValue(pos+value, haveUniqueValue, uniqueValue)) {
                return NULL;
            }
            haveUniqueValue=TRUE;
        }
    } while(--length>1);
    return pos+1;  // ignore the last comparison byte
}